

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_c.cpp
# Opt level: O0

void removeAllComparatorsAndCopiers_c(void)

{
  MockCFunctionComparatorNode *pMVar1;
  MockCFunctionCopierNode *pMVar2;
  MockCFunctionCopierNode *next_1;
  MockCFunctionComparatorNode *next;
  
  pMVar1 = comparatorList_;
  while (comparatorList_ = pMVar1, pMVar2 = copierList_,
        comparatorList_ != (MockCFunctionComparatorNode *)0x0) {
    pMVar1 = comparatorList_->next_;
    if (comparatorList_ != (MockCFunctionComparatorNode *)0x0) {
      (*(comparatorList_->super_MockNamedValueComparator)._vptr_MockNamedValueComparator[1])();
    }
  }
  while (copierList_ = pMVar2, copierList_ != (MockCFunctionCopierNode *)0x0) {
    pMVar2 = copierList_->next_;
    if (copierList_ != (MockCFunctionCopierNode *)0x0) {
      (*(copierList_->super_MockNamedValueCopier)._vptr_MockNamedValueCopier[1])();
    }
  }
  (*currentMockSupport->_vptr_MockSupport[0x2f])();
  return;
}

Assistant:

static void removeAllComparatorsAndCopiers_c()
{
    while (comparatorList_) {
        MockCFunctionComparatorNode *next = comparatorList_->next_;
        delete comparatorList_;
        comparatorList_ = next;
    }
    while (copierList_) {
        MockCFunctionCopierNode *next = copierList_->next_;
        delete copierList_;
        copierList_ = next;
    }
    currentMockSupport->removeAllComparatorsAndCopiers();
}